

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extpubkey.cpp
# Opt level: O0

void __thiscall
ExtPubkey_DefaultConstructorTest_Test::TestBody(ExtPubkey_DefaultConstructorTest_Test *this)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  char *in_R9;
  string local_188;
  AssertHelper local_168;
  Message local_160;
  bool local_151;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_;
  Message local_138;
  ByteData local_130;
  string local_118 [32];
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_1;
  Message local_e0 [3];
  ByteData local_c8;
  string local_b0 [32];
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  ExtPubkey extkey;
  ExtPubkey_DefaultConstructorTest_Test *this_local;
  
  cfd::core::ExtPubkey::ExtPubkey((ExtPubkey *)&gtest_ar.message_);
  cfd::core::ExtPubkey::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_90,"\"\"","extkey.GetData().GetHex().c_str()","",pcVar3);
  std::__cxx11::string::~string(local_b0);
  cfd::core::ByteData::~ByteData(&local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(local_e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_extpubkey.cpp"
               ,0x18,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  cfd::core::ExtPubkey::GetVersionData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_f8,"\"00000000\"","extkey.GetVersionData().GetHex().c_str()",
             "00000000",pcVar3);
  std::__cxx11::string::~string(local_118);
  cfd::core::ByteData::~ByteData(&local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_extpubkey.cpp"
               ,0x19,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  bVar2 = cfd::core::ExtPubkey::IsValid();
  local_151 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_150,&local_151,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_188,(internal *)local_150,(AssertionResult *)"extkey.IsValid()","true","false"
               ,in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_extpubkey.cpp"
               ,0x1a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(ExtPubkey, DefaultConstructorTest) {
  ExtPubkey extkey = ExtPubkey();

  EXPECT_STREQ("", extkey.GetData().GetHex().c_str());
  EXPECT_STREQ("00000000", extkey.GetVersionData().GetHex().c_str());
  EXPECT_FALSE(extkey.IsValid());
}